

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

void adapt::cuf::detail::Format_impl<double,double,std::__cxx11::string>
               (string *result,const_iterator *it,const_iterator *itend,double *value,double *values
               ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_1)

{
  bool bVar1;
  reference pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_local_1;
  double *values_local;
  double *value_local;
  const_iterator *itend_local;
  const_iterator *it_local;
  string *result_local;
  
  do {
    bVar1 = __gnu_cxx::operator!=(it,itend);
    if (!bVar1) {
      return;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(it);
    if (*pcVar2 == '%') {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(it);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(it);
      if (*pcVar2 != '%') {
        bVar1 = __gnu_cxx::operator!=(it,itend);
        if (bVar1) {
          AddArg<double>(result,it,itend,value);
        }
        Format_impl<double,std::__cxx11::string>(result,it,itend,values,values_1);
        return;
      }
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(it);
    std::__cxx11::string::operator+=((string *)result,*pcVar2);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(it);
  } while( true );
}

Assistant:

void Format_impl(std::string& result,
				 std::string::const_iterator& it, std::string::const_iterator& itend,
				 const Value& value, const Values& ...values)
{
	while (it != itend)
	{
		switch (*it)
		{
		case '%':
			++it;
			if (*it != '%')
			{
				if (it != itend)
					AddArg(result, it, itend, value);
				return Format_impl(result, it, itend, values...);
			}
			[[fallthrough]];
		default:
			result += *it;
			++it;
		}
	}
}